

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl::setFormat(Private_Impl *this,RASPICAM_FORMAT fmt)

{
  ostream *poVar1;
  
  if (this->_isOpened == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x21c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"setFormat",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,": can not change format with camera already opened",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  (this->State).captureFtm = fmt;
  return;
}

Assistant:

void Private_Impl::setFormat ( RASPICAM_FORMAT fmt ) {
            if ( isOpened() ) {
                cerr<<__FILE__<<":"<<__LINE__<<":"<<__func__<<": can not change format with camera already opened"<<endl;
                return;
            }
            State.captureFtm = fmt;
        }